

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::IsLinkLookupScope(cmGeneratorTarget *this,string *n,cmLocalGenerator **lg)

{
  bool bVar1;
  ulong uVar2;
  cmLocalGenerator *pcVar3;
  string_view str;
  cmLocalGenerator *otherLG;
  string local_78;
  undefined1 local_58 [8];
  cmDirectoryId dirId;
  cmLocalGenerator **lg_local;
  string *n_local;
  cmGeneratorTarget *this_local;
  
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)n);
  dirId.String.field_2._8_8_ = str._M_len;
  bVar1 = cmHasLiteralPrefix<4ul>(str,(char (*) [4])"::@");
  if (bVar1) {
    cmStrLen<4ul>((char (*) [4])"::@");
    std::__cxx11::string::substr((ulong)&local_78,(ulong)n);
    cmDirectoryId::cmDirectoryId((cmDirectoryId *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = cmGlobalGenerator::FindLocalGenerator
                         (this->GlobalGenerator,(cmDirectoryId *)local_58);
      if (pcVar3 == (cmLocalGenerator *)0x0) {
        bVar1 = false;
      }
      else {
        *lg = pcVar3;
        this_local._7_1_ = 1;
        bVar1 = true;
      }
    }
    else {
      *lg = this->LocalGenerator;
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    cmDirectoryId::~cmDirectoryId((cmDirectoryId *)local_58);
    if (bVar1) goto LAB_00927b06;
  }
  this_local._7_1_ = 0;
LAB_00927b06:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::IsLinkLookupScope(std::string const& n,
                                          cmLocalGenerator const*& lg) const
{
  if (cmHasLiteralPrefix(n, CMAKE_DIRECTORY_ID_SEP)) {
    cmDirectoryId const dirId = n.substr(cmStrLen(CMAKE_DIRECTORY_ID_SEP));
    if (dirId.String.empty()) {
      lg = this->LocalGenerator;
      return true;
    }
    if (cmLocalGenerator const* otherLG =
          this->GlobalGenerator->FindLocalGenerator(dirId)) {
      lg = otherLG;
      return true;
    }
  }
  return false;
}